

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetView.cpp
# Opt level: O1

void __thiscall OffsetView::OffsetView(OffsetView *this,float viewDivisor,View *view)

{
  Vector2f *pVVar1;
  
  this->viewDivisor_ = viewDivisor;
  sf::View::View(&this->view_);
  (this->centerOffset_).x = 0;
  (this->centerOffset_).y = 0;
  pVVar1 = sf::View::getSize(view);
  sf::View::setSize(&this->view_,pVVar1);
  pVVar1 = sf::View::getCenter(view);
  setCenter(this,pVVar1->x,pVVar1->y);
  return;
}

Assistant:

OffsetView::OffsetView(float viewDivisor, const sf::View& view) :
    viewDivisor_(viewDivisor),
    view_(),
    centerOffset_() {

    view_.setSize(view.getSize());
    setCenter(view.getCenter());
}